

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::Value(Value *this,string *value)

{
  char *__s;
  uint uVar1;
  char *__dest;
  runtime_error *this_00;
  uint uVar3;
  size_t sVar2;
  
  *(ushort *)&this->field_0x8 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | 0x104;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  __s = (value->_M_dataplus)._M_p;
  uVar1 = (uint)value->_M_string_length;
  if (uVar1 == 0xffffffff) {
    sVar2 = strlen(__s);
    uVar1 = (uint)sVar2;
  }
  uVar3 = 0x7ffffffe;
  if (uVar1 < 0x7ffffffe) {
    uVar3 = uVar1;
  }
  __dest = (char *)malloc((ulong)(uVar3 + 1));
  if (__dest != (char *)0x0) {
    memcpy(__dest,__s,(ulong)uVar3);
    __dest[uVar3] = '\0';
    (this->value_).string_ = __dest;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value::Value(const std::string& value) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateStringValue(value.c_str(), (unsigned int)value.length());
}